

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O1

size_t WebRtc_ReadBuffer(RingBuffer *self,void **data_ptr,void *data,size_t element_count)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  size_t __n;
  void *__dest;
  char *__src;
  
  if (data == (void *)0x0 || self == (RingBuffer *)0x0) {
    return 0;
  }
  if (self->rw_wrap == SAME_WRAP) {
    uVar3 = self->write_pos - self->read_pos;
  }
  else {
    uVar3 = (self->element_count - self->read_pos) + self->write_pos;
  }
  if (uVar3 < element_count) {
    element_count = uVar3;
  }
  uVar3 = self->element_count - self->read_pos;
  sVar1 = self->element_size;
  sVar4 = (element_count - uVar3) * sVar1;
  pcVar2 = self->data;
  if (element_count <= uVar3) {
    sVar4 = 0;
    pcVar2 = (char *)0x0;
    uVar3 = element_count;
  }
  __src = self->data + self->read_pos * sVar1;
  __n = uVar3 * sVar1;
  if (sVar4 == 0) {
    __dest = data;
    data = __src;
    if (data_ptr == (void **)0x0) goto LAB_001485d2;
  }
  else {
    memcpy(data,__src,__n);
    __dest = (void *)(__n + (long)data);
    __n = sVar4;
    __src = pcVar2;
LAB_001485d2:
    memcpy(__dest,__src,__n);
    __src = (char *)data;
    if (data_ptr == (void **)0x0) goto LAB_001485ea;
  }
  *data_ptr = __src;
LAB_001485ea:
  WebRtc_MoveReadPtr(self,(int)element_count);
  return element_count;
}

Assistant:

size_t WebRtc_ReadBuffer(RingBuffer* self,
                         void** data_ptr,
                         void* data,
                         size_t element_count) {

  if (self == NULL) {
    return 0;
  }
  if (data == NULL) {
    return 0;
  }

  {
    void* buf_ptr_1 = NULL;
    void* buf_ptr_2 = NULL;
    size_t buf_ptr_bytes_1 = 0;
    size_t buf_ptr_bytes_2 = 0;
    const size_t read_count = GetBufferReadRegions(self,
                                                   element_count,
                                                   &buf_ptr_1,
                                                   &buf_ptr_bytes_1,
                                                   &buf_ptr_2,
                                                   &buf_ptr_bytes_2);

    if (buf_ptr_bytes_2 > 0) {
      // We have a wrap around when reading the buffer. Copy the buffer data to
      // |data| and point to it.
      memcpy(data, buf_ptr_1, buf_ptr_bytes_1);
      memcpy(((char*) data) + buf_ptr_bytes_1, buf_ptr_2, buf_ptr_bytes_2);
      buf_ptr_1 = data;
    } else if (!data_ptr) {
      // No wrap, but a memcpy was requested.
      memcpy(data, buf_ptr_1, buf_ptr_bytes_1);
    }
    if (data_ptr) {
      // |buf_ptr_1| == |data| in the case of a wrap.
      *data_ptr = buf_ptr_1;
    }

    // Update read position
    WebRtc_MoveReadPtr(self, (int) read_count);

    return read_count;
  }
}